

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int remove(char *__filename)

{
  bool bVar1;
  byte bVar2;
  int extraout_EAX;
  ostream *poVar3;
  int *piVar4;
  undefined8 in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  path local_e0;
  undefined1 local_b8 [8];
  path imagePath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *imageId;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  path imageDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *imageIds_local;
  string *rootDir_local;
  
  imageDir._32_8_ = in_RSI;
  std::operator+(&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__filename,
                 "/images");
  std::filesystem::__cxx11::path::path((path *)local_40,&local_60,auto_format);
  std::__cxx11::string::~string((string *)&local_60);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)imageDir._32_8_);
  imageId = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)imageDir._32_8_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&imageId), bVar1) {
    imagePath._32_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    std::operator+(&local_100,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   imagePath._32_8_,".tar.gz");
    std::filesystem::__cxx11::path::path(&local_e0,&local_100,auto_format);
    std::filesystem::__cxx11::operator/((path *)local_b8,(path *)local_40,&local_e0);
    std::filesystem::__cxx11::path::~path(&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    bVar1 = std::filesystem::exists((path *)local_b8);
    if (bVar1) {
      bVar2 = std::filesystem::remove((path *)local_b8);
      if ((bVar2 & 1) == 0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Failed to remove image with ID ");
        poVar3 = std::operator<<(poVar3,(string *)imagePath._32_8_);
        poVar3 = std::operator<<(poVar3,": [Errno ");
        piVar4 = __errno_location();
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar4);
        poVar3 = std::operator<<(poVar3,"]");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"Removed image with ID ");
        poVar3 = std::operator<<(poVar3,(string *)imagePath._32_8_);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      poVar3 = std::operator<<((ostream *)&std::cout,"Image with ID ");
      poVar3 = std::operator<<(poVar3,(string *)imagePath._32_8_);
      poVar3 = std::operator<<(poVar3," does not exist");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    std::filesystem::__cxx11::path::~path((path *)local_b8);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::filesystem::__cxx11::path::~path((path *)local_40);
  return extraout_EAX;
}

Assistant:

void remove(const std::string& rootDir, const std::vector<std::string>& imageIds)
{
    std::filesystem::path imageDir(rootDir + "/images");
    for (const auto& imageId : imageIds)
    {
        auto imagePath = imageDir / (imageId + ".tar.gz");
        if (!std::filesystem::exists(imagePath))
        {
            std::cout << "Image with ID " << imageId << " does not exist" << std::endl;
        }
        else
        {
            if (std::filesystem::remove(imagePath))
                std::cout << "Removed image with ID " << imageId << std::endl;
            else
                std::cout << "Failed to remove image with ID " << imageId << ": [Errno " << errno << "]" << std::endl;
        }
    }
}